

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

ID __thiscall Fl_Plugin_Manager::addPlugin(Fl_Plugin_Manager *this,char *name,Fl_Plugin *plugin)

{
  Node *pNVar1;
  anon_union_8_2_7f9ed1a6 v;
  byte bVar2;
  ushort uVar11;
  undefined1 auVar3 [16];
  undefined1 auVar10 [16];
  Fl_Preferences pin;
  char buf [34];
  Fl_Preferences local_60;
  char local_48;
  char local_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char cStack_38;
  undefined1 local_37;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  local_60._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  local_60.rootNode = (this->super_Fl_Preferences).rootNode;
  pNVar1 = Fl_Preferences::Node::addChild((this->super_Fl_Preferences).node,name);
  local_48 = '@';
  auVar3._0_2_ = (ushort)plugin >> 4;
  uVar11 = (ushort)((ulong)plugin >> 0x34);
  auVar5._0_10_ = (unkuint10)uVar11 << 0x30;
  auVar7._0_12_ = ZEXT212(uVar11) << 0x30;
  auVar9._0_14_ = ZEXT214(uVar11) << 0x30;
  bVar2 = (byte)((ulong)plugin >> 0x38);
  auVar9[0xe] = bVar2 >> 4;
  auVar9[0xf] = bVar2;
  auVar8._14_2_ = auVar9._14_2_;
  auVar8._0_13_ = ZEXT213(uVar11) << 0x30;
  auVar8[0xd] = (char)((ulong)plugin >> 0x30);
  auVar7._13_3_ = auVar8._13_3_;
  auVar7[0xc] = (char)uVar11;
  bVar2 = (byte)((ulong)plugin >> 0x28);
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_11_ = ZEXT211(uVar11) << 0x30;
  auVar6[0xb] = bVar2;
  auVar5._11_5_ = auVar6._11_5_;
  auVar5[10] = bVar2 >> 4;
  auVar4._10_6_ = auVar5._10_6_;
  auVar4._0_9_ = (unkuint9)uVar11 << 0x30;
  auVar4[9] = (char)((ulong)plugin >> 0x20);
  bVar2 = (byte)((ulong)plugin >> 0x18);
  auVar3._8_8_ = (undefined8)
                 (CONCAT73(auVar4._9_7_,
                           CONCAT12((char)((ushort)((ulong)plugin >> 0x20) >> 4),uVar11)) >> 0x10);
  auVar3[7] = bVar2;
  auVar3[6] = bVar2 >> 4;
  auVar3[5] = (char)((ulong)plugin >> 0x10);
  auVar3[4] = (char)((ushort)((ulong)plugin >> 0x10) >> 4);
  bVar2 = (byte)((ulong)plugin >> 8);
  auVar3[3] = bVar2;
  auVar3[2] = bVar2 >> 4;
  auVar10._2_14_ = auVar3._2_14_;
  auVar10[0] = (undefined1)auVar3._0_2_;
  auVar10[1] = (char)plugin;
  auVar10 = auVar10 & _DAT_0021ca70;
  local_47 = auVar10[0] + 'A';
  cStack_46 = auVar10[1] + 'A';
  cStack_45 = auVar10[2] + 'A';
  cStack_44 = auVar10[3] + 'A';
  cStack_43 = auVar10[4] + 'A';
  cStack_42 = auVar10[5] + 'A';
  cStack_41 = auVar10[6] + 'A';
  cStack_40 = auVar10[7] + 'A';
  cStack_3f = auVar10[8] + 'A';
  cStack_3e = auVar10[9] + 'A';
  cStack_3d = auVar10[10] + 'A';
  cStack_3c = auVar10[0xb] + 'A';
  cStack_3b = auVar10[0xc] + 'A';
  cStack_3a = auVar10[0xd] + 'A';
  cStack_39 = auVar10[0xe] + 'A';
  cStack_38 = auVar10[0xf] + 'A';
  local_37 = 0;
  local_60.node = pNVar1;
  Fl_Preferences::set(&local_60,"address",&local_48);
  ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_60);
  return pNVar1;
}

Assistant:

Fl_Preferences::ID Fl_Plugin_Manager::addPlugin(const char *name, Fl_Plugin *plugin) {
  char buf[34];
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: adding plugin named \"%s\" at 0x%p\n", name, plugin);
#endif
  Fl_Preferences pin(this, name);
  buf[0] = '@'; p2a(plugin, buf+1);
  pin.set("address", buf);
  return pin.id();
}